

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# v_font.cpp
# Opt level: O2

void __thiscall FSingleLumpFont::LoadBMF(FSingleLumpFont *this,int lump,BYTE *data)

{
  ushort uVar1;
  long lVar2;
  uint uVar3;
  CharData *pCVar4;
  int *piVar5;
  ulong uVar6;
  BYTE *pBVar7;
  FFontChar2 *this_00;
  byte bVar8;
  long lVar9;
  ulong uVar10;
  int iVar11;
  uint uVar12;
  int iVar13;
  uint uVar14;
  uint uVar15;
  int iVar16;
  int iVar17;
  byte *pbVar19;
  bool bVar20;
  uint local_76c;
  int local_760;
  PalEntry sort_palette [256];
  BYTE raw_palette [768];
  uint uVar18;
  
  this->FontType = BMFFONT;
  (this->super_FFont).FontHeight = (uint)data[5];
  (this->super_FFont).GlobalKerning = (int)(char)data[8];
  bVar8 = data[0x10];
  (this->super_FFont).ActiveColors = (uint)bVar8;
  (this->super_FFont).SpaceWidth = -1;
  this->RescalePalette = true;
  lVar2 = (ulong)bVar8 * 3;
  lVar2 = (ulong)data[lVar2 + 0x11] + 0x14 + lVar2;
  uVar1 = *(ushort *)(data + lVar2 + -2);
  uVar3 = (uint)uVar1;
  (this->super_FFont).FirstChar = 0x100;
  (this->super_FFont).LastChar = 0;
  uVar12 = 0x100;
  uVar18 = 0;
  uVar14 = (uint)uVar1;
  uVar6 = 0;
  iVar16 = 0;
  while (bVar20 = uVar3 != 0, uVar3 = uVar3 - 1, bVar20) {
    bVar8 = data[uVar6 + lVar2 + 1];
    if (((bVar8 != 0) && (data[uVar6 + lVar2 + 2] != '\0')) || (data[uVar6 + lVar2 + 5] != '\0')) {
      bVar8 = data[uVar6 + lVar2];
      uVar15 = (uint)bVar8;
      if (bVar8 < uVar12) {
        (this->super_FFont).FirstChar = uVar15;
        uVar15 = (uint)data[uVar6 + lVar2];
        uVar12 = (uint)bVar8;
      }
      if (uVar18 < uVar15) {
        (this->super_FFont).LastChar = uVar15;
        uVar18 = uVar15;
      }
      bVar8 = data[uVar6 + lVar2 + 1];
      iVar16 = iVar16 + (uint)bVar8;
    }
    uVar6 = (ulong)((int)uVar6 + (uint)data[uVar6 + lVar2 + 2] * (uint)bVar8 + 6);
  }
  if (uVar18 < uVar12) {
    I_FatalError("BMF font defines no characters");
    uVar12 = (this->super_FFont).FirstChar;
    uVar18 = (this->super_FFont).LastChar;
  }
  iVar17 = uVar18 - uVar12;
  uVar6 = 0xffffffffffffffff;
  if (-2 < iVar17) {
    uVar6 = (long)iVar17 * 0x10 + 0x10;
  }
  pCVar4 = (CharData *)operator_new__(uVar6);
  (this->super_FFont).Chars = pCVar4;
  piVar5 = &pCVar4->XMove;
  for (lVar9 = 0; lVar9 <= iVar17; lVar9 = lVar9 + 1) {
    ((CharData *)(piVar5 + -2))->Pic = (FTexture *)0x0;
    *piVar5 = -0x80000000;
    piVar5 = piVar5 + 4;
  }
  iVar11 = (this->super_FFont).ActiveColors;
  uVar10 = 0;
  uVar6 = (ulong)(uint)(iVar11 * 3);
  if (iVar11 * 3 < 1) {
    uVar6 = uVar10;
  }
  for (; uVar6 != uVar10; uVar10 = uVar10 + 1) {
    raw_palette[uVar10 + 3] = data[uVar10 + 0x11] >> 4 | data[uVar10 + 0x11] * '\x04';
  }
  (this->super_FFont).ActiveColors = iVar11 + 1;
  pBVar7 = raw_palette + 2;
  for (lVar9 = 0; lVar9 <= iVar11; lVar9 = lVar9 + 1) {
    sort_palette[lVar9].field_0.field_0.a = (BYTE)lVar9;
    sort_palette[lVar9].field_0.field_0.r = pBVar7[-2];
    sort_palette[lVar9].field_0.field_0.g = pBVar7[-1];
    sort_palette[lVar9].field_0.field_0.b = *pBVar7;
    pBVar7 = pBVar7 + 3;
  }
  qsort(sort_palette + 1,(long)iVar11,4,BMFCompare);
  iVar11 = (this->super_FFont).ActiveColors;
  pBVar7 = (BYTE *)operator_new__((long)iVar11);
  (this->super_FFont).PatchRemap = pBVar7;
  *pBVar7 = '\0';
  for (lVar9 = 1; lVar9 < iVar11; lVar9 = lVar9 + 1) {
    (this->super_FFont).PatchRemap[sort_palette[lVar9].field_0.field_0.a] = (BYTE)lVar9;
    iVar11 = (this->super_FFont).ActiveColors;
  }
  memcpy(this->PaletteData,raw_palette,0x300);
  local_76c = 0xffffffff;
  uVar6 = 0;
  while( true ) {
    bVar20 = uVar14 == 0;
    uVar14 = uVar14 - 1;
    if (bVar20) {
      if ((this->super_FFont).SpaceWidth < 0) {
        if ((int)local_76c < 0) {
          local_76c = (iVar16 * 2) / ((iVar17 + 1) * 3);
        }
        (this->super_FFont).SpaceWidth = local_76c;
      }
      FFont::FixXMoves(&this->super_FFont);
      (*(this->super_FFont)._vptr_FFont[4])(this);
      return;
    }
    bVar8 = data[uVar6 + lVar2];
    iVar11 = (this->super_FFont).FirstChar;
    iVar13 = (uint)bVar8 - iVar11;
    if (iVar13 < 0) break;
    if (iVar17 < iVar13) {
      __assert_fail("chardata[chari] - FirstChar < count",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/v_font.cpp"
                    ,0x508,"void FSingleLumpFont::LoadBMF(int, const BYTE *)");
    }
    pbVar19 = data + uVar6 + lVar2;
    if (bVar8 == 0x4e) {
      local_76c = (uint)pbVar19[5];
      bVar8 = 0x4e;
    }
    else if (bVar8 == 0x20) {
      (this->super_FFont).SpaceWidth = (uint)pbVar19[5];
      bVar8 = *pbVar19;
    }
    (this->super_FFont).Chars[(int)((uint)bVar8 - iVar11)].XMove = (uint)pbVar19[5];
    uVar12 = (uint)pbVar19[1];
    if (pbVar19[1] == 0) {
      uVar12 = 0;
    }
    else {
      bVar8 = pbVar19[2];
      if (bVar8 != 0) {
        this_00 = (FFontChar2 *)operator_new(0x78);
        local_760 = (int)data;
        FFontChar2::FFontChar2
                  (this_00,lump,((int)pbVar19 - local_760) + 6,uVar12,(uint)bVar8,
                   -(int)(char)pbVar19[3],-(int)(char)pbVar19[4]);
        (this->super_FFont).Chars[(ulong)*pbVar19 - (long)(this->super_FFont).FirstChar].Pic =
             (FTexture *)this_00;
        uVar12 = (uint)pbVar19[1];
      }
    }
    uVar6 = (ulong)((int)uVar6 + pbVar19[2] * uVar12 + 6);
  }
  __assert_fail("chardata[chari] - FirstChar >= 0",
                "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/v_font.cpp"
                ,0x507,"void FSingleLumpFont::LoadBMF(int, const BYTE *)");
}

Assistant:

void FSingleLumpFont::LoadBMF(int lump, const BYTE *data)
{
	const BYTE *chardata;
	int numchars, count, totalwidth, nwidth;
	int infolen;
	int i, chari;
	BYTE raw_palette[256*3];
	PalEntry sort_palette[256];

	FontType = BMFFONT;
	FontHeight = data[5];
	GlobalKerning = (SBYTE)data[8];
	ActiveColors = data[16];
	SpaceWidth = -1;
	nwidth = -1;
	RescalePalette = true;

	infolen = data[17 + ActiveColors*3];
	chardata = data + 18 + ActiveColors*3 + infolen;
	numchars = chardata[0] + 256*chardata[1];
	chardata += 2;

	// Scan for lowest and highest characters defined and total font width.
	FirstChar = 256;
	LastChar = 0;
	totalwidth = 0;
	for (i = chari = 0; i < numchars; ++i, chari += 6 + chardata[chari+1] * chardata[chari+2])
	{
		if ((chardata[chari+1] == 0 || chardata[chari+2] == 0) && chardata[chari+5] == 0)
		{ // Don't count empty characters.
			continue;
		}
		if (chardata[chari] < FirstChar)
		{
			FirstChar = chardata[chari];
		}
		if (chardata[chari] > LastChar)
		{
			LastChar = chardata[chari];
		}
		totalwidth += chardata[chari+1];
	}
	if (LastChar < FirstChar)
	{
		I_FatalError("BMF font defines no characters");
	}
	count = LastChar - FirstChar + 1;
	Chars = new CharData[count];
	for (i = 0; i < count; ++i)
	{
		Chars[i].Pic = NULL;
		Chars[i].XMove = INT_MIN;
	}

	// BMF palettes are only six bits per component. Fix that.
	for (i = 0; i < ActiveColors*3; ++i)
	{
		raw_palette[i+3] = (data[17 + i] << 2) | (data[17 + i] >> 4);
	}
	ActiveColors++;

	// Sort the palette by increasing brightness
	for (i = 0; i < ActiveColors; ++i)
	{
		PalEntry *pal = &sort_palette[i];
		pal->a = i;		// Use alpha part to point back to original entry
		pal->r = raw_palette[i*3 + 0];
		pal->g = raw_palette[i*3 + 1];
		pal->b = raw_palette[i*3 + 2];
	}
	qsort(sort_palette + 1, ActiveColors - 1, sizeof(PalEntry), BMFCompare);

	// Create the PatchRemap table from the sorted "alpha" values.
	PatchRemap = new BYTE[ActiveColors];
	PatchRemap[0] = 0;
	for (i = 1; i < ActiveColors; ++i)
	{
		PatchRemap[sort_palette[i].a] = i;
	}

	memcpy(PaletteData, raw_palette, 768);

	// Now scan through the characters again, creating glyphs for each one.
	for (i = chari = 0; i < numchars; ++i, chari += 6 + chardata[chari+1] * chardata[chari+2])
	{
		assert(chardata[chari] - FirstChar >= 0);
		assert(chardata[chari] - FirstChar < count);
		if (chardata[chari] == ' ')
		{
			SpaceWidth = chardata[chari+5];
		}
		else if (chardata[chari] == 'N')
		{
			nwidth = chardata[chari+5];
		}
		Chars[chardata[chari] - FirstChar].XMove = chardata[chari+5];
		if (chardata[chari+1] == 0 || chardata[chari+2] == 0)
		{ // Empty character: skip it.
			continue;
		}
		Chars[chardata[chari] - FirstChar].Pic = new FFontChar2(lump, int(chardata + chari + 6 - data),
			chardata[chari+1],	// width
			chardata[chari+2],	// height
			-(SBYTE)chardata[chari+3],	// x offset
			-(SBYTE)chardata[chari+4]	// y offset
		);
	}

	// If the font did not define a space character, determine a suitable space width now.
	if (SpaceWidth < 0)
	{
		if (nwidth >= 0)
		{
			SpaceWidth = nwidth;
		}
		else
		{
			SpaceWidth = totalwidth * 2 / (3 * count);
		}
	}

	FixXMoves();
	LoadTranslations();
}